

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

int SSL_CTX_set1_tls_channel_id(SSL_CTX *ctx,EVP_PKEY *private_key)

{
  pointer __p;
  int iVar1;
  pointer local_20;
  
  iVar1 = is_p256_key(private_key);
  if (iVar1 == 0) {
    ERR_put_error(0x10,0,0x80,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0x927);
  }
  else {
    bssl::UpRef((bssl *)&local_20,private_key);
    __p = local_20;
    local_20 = (pointer)0x0;
    std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&ctx->channel_id_private,__p
              );
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_20);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int SSL_CTX_set1_tls_channel_id(SSL_CTX *ctx, EVP_PKEY *private_key) {
  if (!is_p256_key(private_key)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CHANNEL_ID_NOT_P256);
    return 0;
  }

  ctx->channel_id_private = UpRef(private_key);
  return 1;
}